

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase393::run(TestCase393 *this)

{
  bool bVar1;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> local_158;
  bool local_141;
  undefined1 auStack_140 [7];
  bool _kj_shouldLog_1;
  size_t local_138;
  ArrayPtr<const_char> local_130;
  undefined1 local_120 [8];
  DebugComparison<kj::StringPtr,_const_char_(&)[13]> _kjCondition_1;
  undefined1 auStack_e8 [5];
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  Method local_d8;
  Schema local_98;
  StructSchema results;
  Schema local_80;
  Reader local_78;
  Schema local_48;
  Schema local_40;
  InterfaceSchema schema;
  SchemaLoader loader;
  TestCase393 *this_local;
  
  SchemaLoader::SchemaLoader((SchemaLoader *)&schema);
  local_80.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestStreaming>();
  Schema::getProto(&local_78,&local_80);
  local_48 = SchemaLoader::load((SchemaLoader *)&schema,&local_78);
  local_40.raw = (RawBrandedSchema *)Schema::asInterface(&local_48);
  kj::StringPtr::StringPtr((StringPtr *)auStack_e8,"doStreamI");
  InterfaceSchema::getMethodByName(&local_d8,(InterfaceSchema *)&local_40,(StringPtr)_auStack_e8);
  local_98.raw = (RawBrandedSchema *)InterfaceSchema::Method::getResultType(&local_d8);
  _kjCondition_1._46_1_ = StructSchema::isStreamResult((StructSchema *)&local_98);
  _kjCondition_1._47_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_1.field_0x2e);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_1.field_0x2f);
  if (!bVar1) {
    _kjCondition_1._45_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._45_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,400,ERROR,"\"failed: expected \" \"results.isStreamResult()\", _kjCondition",
                 (char (*) [42])"failed: expected results.isStreamResult()",
                 (DebugExpression<bool> *)&_kjCondition_1.field_0x2f);
      _kjCondition_1._45_1_ = 0;
    }
  }
  _auStack_140 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&local_98);
  local_130 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)auStack_140);
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[13]> *)local_120,
             (DebugExpression<kj::StringPtr> *)&local_130,(char (*) [13])"StreamResult");
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_120);
  if (!bVar1) {
    local_141 = kj::_::Debug::shouldLog(ERROR);
    while (local_141 != false) {
      AVar2 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&local_98);
      local_158 = AVar2;
      kj::_::Debug::
      log<char_const(&)[65],kj::_::DebugComparison<kj::StringPtr,char_const(&)[13]>&,kj::StringPtr>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x191,ERROR,
                 "\"failed: expected \" \"results.getShortDisplayName() == \\\"StreamResult\\\"\", _kjCondition, results.getShortDisplayName()"
                 ,(char (*) [65])
                  "failed: expected results.getShortDisplayName() == \"StreamResult\"",
                 (DebugComparison<kj::StringPtr,_const_char_(&)[13]> *)local_120,
                 (StringPtr *)&local_158);
      local_141 = false;
    }
  }
  SchemaLoader::~SchemaLoader((SchemaLoader *)&schema);
  return;
}

Assistant:

TEST(SchemaLoader, LoadStreaming) {
  SchemaLoader loader;

  InterfaceSchema schema =
      loader.load(Schema::from<test::TestStreaming>().getProto()).asInterface();

  auto results = schema.getMethodByName("doStreamI").getResultType();
  KJ_EXPECT(results.isStreamResult());
  KJ_EXPECT(results.getShortDisplayName() == "StreamResult", results.getShortDisplayName());
}